

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O3

void __thiscall fsbridge::FileLock::FileLock(FileLock *this,path *file)

{
  int iVar1;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  (this->reason)._M_string_length = 0;
  (this->reason).field_2._M_local_buf[0] = '\0';
  this->fd = -1;
  iVar1 = open((file->super_path)._M_pathname._M_dataplus._M_p,2);
  this->fd = iVar1;
  if (iVar1 == -1) {
    __errno_location();
    SysErrorString_abi_cxx11_(in_stack_ffffffffffffffbc);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->reason,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FileLock::FileLock(const fs::path& file)
{
    fd = open(file.c_str(), O_RDWR);
    if (fd == -1) {
        reason = GetErrorReason();
    }
}